

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

DecodePsbtOutputStruct * __thiscall
cfd::api::json::DecodePsbtOutput::ConvertToStruct
          (DecodePsbtOutputStruct *__return_storage_ptr__,DecodePsbtOutput *this)

{
  PsbtScriptDataStruct PStack_a8;
  
  DecodePsbtOutputStruct::DecodePsbtOutputStruct(__return_storage_ptr__);
  PsbtScriptData::ConvertToStruct(&PStack_a8,&this->redeem_script_);
  PsbtScriptDataStruct::operator=(&__return_storage_ptr__->redeem_script,&PStack_a8);
  PsbtScriptDataStruct::~PsbtScriptDataStruct(&PStack_a8);
  PsbtScriptData::ConvertToStruct(&PStack_a8,&this->witness_script_);
  PsbtScriptDataStruct::operator=(&__return_storage_ptr__->witness_script,&PStack_a8);
  PsbtScriptDataStruct::~PsbtScriptDataStruct(&PStack_a8);
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)&PStack_a8,
             &this->bip32_derivs_);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::_M_move_assign
            (&__return_storage_ptr__->bip32_derivs,&PStack_a8);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::~vector
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)&PStack_a8);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&PStack_a8,
             &this->unknown_);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::_M_move_assign
            (&__return_storage_ptr__->unknown,&PStack_a8);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&PStack_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtOutputStruct DecodePsbtOutput::ConvertToStruct() const {  // NOLINT
  DecodePsbtOutputStruct result;
  result.redeem_script = redeem_script_.ConvertToStruct();
  result.witness_script = witness_script_.ConvertToStruct();
  result.bip32_derivs = bip32_derivs_.ConvertToStruct();
  result.unknown = unknown_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}